

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O0

void testwin3(wins *wins_ar,int ar_len)

{
  char *local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  Am_Style *local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined8 local_60;
  Am_Style *local_58;
  Am_Drawonable *local_50;
  undefined1 *local_48;
  Am_Drawonable *local_40;
  Am_Style local_28 [8];
  Am_Drawonable *local_20;
  Am_Drawonable *the_d3;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  the_d3._4_4_ = ar_len;
  _i = wins_ar;
  for (the_d3._0_4_ = 0; (int)the_d3 < the_d3._4_4_; the_d3._0_4_ = (int)the_d3 + 1) {
    local_50 = _i[(int)the_d3].root;
    local_58 = local_28;
    Am_Style::Am_Style(local_58,(Am_Style *)&red);
    local_b0 = local_58;
    local_c8 = "D3 Icon";
    local_60 = 0;
    local_68 = 1;
    local_70 = 0;
    local_78 = 0;
    local_80 = 1;
    local_88 = 0;
    local_90 = 0;
    local_98 = 1;
    local_a0 = 1;
    local_a8 = 0;
    local_b8 = 1;
    local_c0 = 1;
    local_48 = (undefined1 *)&local_c8;
    local_40 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_50)(local_50,10,0x32,200,200,"D3");
    Am_Style::~Am_Style(local_28);
    local_20 = local_40;
    _i[(int)the_d3].d3 = local_40;
  }
  printf("Hit RETURN to de-iconify red window:");
  getchar();
  for (the_d3._0_4_ = 0; (int)the_d3 < the_d3._4_4_; the_d3._0_4_ = (int)the_d3 + 1) {
    (**(code **)(*(long *)_i[(int)the_d3].d3 + 0x38))(_i[(int)the_d3].d3,0);
  }
  printf("Hit RETURN to re-iconify red window:");
  getchar();
  for (the_d3._0_4_ = 0; (int)the_d3 < the_d3._4_4_; the_d3._0_4_ = (int)the_d3 + 1) {
    (**(code **)(*(long *)_i[(int)the_d3].d3 + 0x38))(_i[(int)the_d3].d3,1);
  }
  return;
}

Assistant:

void
testwin3(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up iconified window:");
  //getchar();

  int i;
  for (i = 0; i < ar_len; i++) {
    Am_Drawonable *the_d3 =
        (wins_ar[i].root)
            ->Create(10, 50, 200, 200, "D3", "D3 Icon", true, true, red);
    wins_ar[i].d3 = the_d3;
  }

  printf("Hit RETURN to de-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(false);
  }

  printf("Hit RETURN to re-iconify red window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d3)->Set_Iconify(true);
  }
}